

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O1

int cmd_exists(char *args)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar3 = args;
  if (*args == '\"') {
    pcVar3 = args + 1;
    sVar2 = strlen(pcVar3);
    args[sVar2] = '\0';
  }
  iVar1 = PHYSFS_exists(pcVar3);
  pcVar3 = "";
  if (iVar1 == 0) {
    pcVar3 = "does not ";
  }
  printf("File %sexists.\n",pcVar3);
  return 1;
}

Assistant:

static int cmd_exists(char *args)
{
    int rc;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    rc = PHYSFS_exists(args);
    printf("File %sexists.\n", rc ? "" : "does not ");
    return 1;
}